

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O1

int do_xor(void)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  byte bVar6;
  vm_register *pvVar7;
  undefined4 *puVar8;
  ushort uVar9;
  int temp;
  uint uVar10;
  byte bVar11;
  byte bVar12;
  bool bVar13;
  
  pvVar7 = registe_ptr;
  uVar3 = registe_ptr->IP;
  bVar1 = code_ptr[uVar3 + 2];
  bVar6 = bVar1 >> 4;
  bVar12 = bVar1 & 0xf;
  if (code_ptr[uVar3 + 1] == '\x01') {
    if (bVar12 == 2) {
      uVar3 = *(uint *)(code_ptr + (ulong)uVar3 + 3);
      uVar5 = *register_list[bVar6];
      uVar10 = uVar5 ^ uVar3;
      *register_list[bVar6] = uVar10;
      if (uVar5 != uVar3) {
LAB_001040c5:
        pvVar7->flag[0] = '\x01';
        if (0 < (int)uVar10) {
          pvVar7->flag[1] = '\x01';
          return 1;
        }
        pvVar7->flag[1] = '\0';
        return 1;
      }
LAB_00104096:
      pvVar7->flag[0] = '\0';
      return 1;
    }
    if (bVar12 == 1) {
      uVar4 = *(undefined4 *)(code_ptr + (ulong)uVar3 + 3);
      uVar2 = (ushort)*register_list[bVar6];
      uVar9 = uVar2 ^ (ushort)uVar4;
      *(ushort *)register_list[bVar6] = uVar9;
      if (uVar2 == (ushort)uVar4) goto LAB_00104096;
LAB_0010406b:
      bVar13 = (short)uVar9 < 0;
      if (0 < (short)uVar9) goto LAB_00104070;
      goto LAB_00104012;
    }
    if ((bVar1 & 0xf) != 0) goto LAB_001040d9;
    bVar1 = code_ptr[(ulong)uVar3 + 3];
    bVar12 = (byte)*register_list[bVar6];
    bVar11 = bVar12 ^ bVar1;
    *(byte *)register_list[bVar6] = bVar11;
    pvVar7 = registe_ptr;
    if (bVar12 == bVar1) goto LAB_00104096;
  }
  else {
    if (code_ptr[uVar3 + 1] != '\0') {
LAB_001040d9:
      puVar8 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar8 = 0xf6;
      __cxa_throw(puVar8,&int::typeinfo,0);
    }
    bVar11 = (byte)code_ptr[uVar3 + 3] >> 4;
    if (bVar12 == 2) {
      uVar3 = *register_list[bVar11];
      uVar5 = *register_list[bVar6];
      uVar10 = uVar5 ^ uVar3;
      *register_list[bVar6] = uVar10;
      if (uVar5 != uVar3) goto LAB_001040c5;
      goto LAB_00104096;
    }
    if (bVar12 == 1) {
      uVar3 = *register_list[bVar11];
      uVar2 = (ushort)*register_list[bVar6];
      uVar9 = uVar2 ^ (ushort)uVar3;
      *(ushort *)register_list[bVar6] = uVar9;
      if (uVar2 == (ushort)uVar3) goto LAB_00104096;
      goto LAB_0010406b;
    }
    if ((bVar1 & 0xf) != 0) goto LAB_001040d9;
    uVar3 = *register_list[bVar11];
    bVar1 = (byte)*register_list[bVar6];
    bVar11 = bVar1 ^ (byte)uVar3;
    *(byte *)register_list[bVar6] = bVar11;
    pvVar7 = registe_ptr;
    if (bVar1 == (byte)uVar3) goto LAB_00104096;
  }
  bVar13 = (char)bVar11 < '\0';
  pvVar7 = registe_ptr;
  if ('\0' < (char)bVar11) {
LAB_00104070:
    pvVar7->flag[0] = '\x01';
    pvVar7->flag[1] = '\x01';
    return 1;
  }
LAB_00104012:
  if (!bVar13) {
    return 1;
  }
  pvVar7->flag[0] = '\x01';
  pvVar7->flag[1] = '\0';
  return 1;
}

Assistant:

int do_xor() {
	uint8_t high = (uint8_t)code_ptr[registe_ptr->IP + 2] / 0x10;
	uint8_t low = (uint8_t)code_ptr[registe_ptr->IP + 2] % 0x10;
	if (code_ptr[registe_ptr->IP + 1] == 0)//0型命令
	{
		uint8_t highb = (uint8_t)code_ptr[registe_ptr->IP + 3] / 0x10;
		if (low == 0) {
			char*Ra = (char *)register_list[high];
			char*Rb = (char*)register_list[highb];
			*Ra ^= *Rb;
			set_flag(*Ra);
		}
		else if (low == 1)
		{
			int16_t*Ra = (int16_t *)register_list[high];
			int16_t*Rb = (int16_t *)register_list[highb];
			*Ra ^= *Rb;
			set_flag(*Ra);
		}
		else if (low == 2)
		{
			unsigned*Ra = (unsigned *)register_list[high];
			unsigned*Rb = (unsigned*)register_list[highb];
			*Ra ^= *Rb;
			set_flag(*Ra);
		}
		else throw(LVM_EXECUTE_ERROR);
	}
	else if (code_ptr[registe_ptr->IP + 1] == 1) {//1型命令
		if (low == 0)//低位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			char *R = (char *)register_list[high];
			*R ^= temp;
			set_flag(*R);
		}
		else if (low == 1)//高位运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			int16_t *R = (int16_t *)register_list[high];
			*R ^= temp;
			set_flag(*R);
		}
		else if (low == 2)//全运算
		{
			unsigned temp = *(unsigned*)(code_ptr + registe_ptr->IP + 2 + 1);//获得立即数
			unsigned *R = (unsigned *)register_list[high];
			*R ^= temp;
			set_flag(*R);
		}
		else throw(LVM_EXECUTE_ERROR);

	}
	else throw(LVM_EXECUTE_ERROR);
	return LVM_SUCCESS;
}